

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

int __thiscall t_html_generator::print_type(t_html_generator *this,t_type *ttype)

{
  ofstream_with_content_based_conditional_update *poVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  char *pcVar8;
  string prog_name;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  char *local_90;
  long local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<code>",6);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  pp_Var2 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar4 != '\0') {
    iVar4 = (*pp_Var2[0xe])();
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if ((char)iVar4 == '\0') {
          iVar4 = 0;
          goto LAB_00239b31;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"map&lt;",7);
        iVar5 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        iVar4 = print_type(this,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
        iVar4 = iVar4 + iVar5 + 5;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"set&lt;",7);
        iVar4 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        iVar4 = iVar4 + 5;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"list&lt;",8);
      iVar4 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      iVar4 = iVar4 + 6;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"&gt;",4);
    goto LAB_00239b31;
  }
  iVar4 = (*pp_Var2[5])(ttype);
  if ((char)iVar4 != '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      local_b0 = local_a0;
      lVar7 = *(long *)CONCAT44(extraout_var_00,iVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,lVar7,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar7);
    }
    else {
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"binary","");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_b0,local_a8);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    iVar4 = (int)*(undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 8);
    goto LAB_00239b31;
  }
  local_b0 = local_a0;
  pcVar3 = (ttype->program_->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (ttype->program_->name_)._M_string_length);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  lVar7 = *(long *)CONCAT44(extraout_var,iVar4);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar7,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<a href=\"",9);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b0,local_b0 + local_a8);
  std::__cxx11::string::append((char *)&local_70);
  make_file_link(&local_50,this,&local_70);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  lVar7 = 7;
  pcVar8 = "Struct_";
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
    if ((char)iVar4 != '\0') goto LAB_00239a74;
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar4 != '\0') goto LAB_00239a74;
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar4 != '\0') {
      lVar7 = 5;
      pcVar8 = "Enum_";
      goto LAB_00239a74;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
    if ((char)iVar4 != '\0') {
      lVar7 = 4;
      pcVar8 = "Svc_";
      goto LAB_00239a74;
    }
  }
  else {
LAB_00239a74:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar8,lVar7);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
  iVar4 = (int)local_88;
  if (ttype->program_ != (this->super_t_generator).program_) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_b0,local_a8)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    iVar4 = iVar4 + (int)local_a8 + 1;
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</a>",4);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
LAB_00239b31:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</code>",7);
  return iVar4;
}

Assistant:

int t_html_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  f_out_ << "<code>";
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << (ttype->is_binary() ? "binary" : ttype->get_name());
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "<a href=\"" << make_file_link(prog_name + ".html") << "#";
    if (ttype->is_typedef()) {
      f_out_ << "Struct_";
    } else if (ttype->is_struct() || ttype->is_xception()) {
      f_out_ << "Struct_";
    } else if (ttype->is_enum()) {
      f_out_ << "Enum_";
    } else if (ttype->is_service()) {
      f_out_ << "Svc_";
    }
    f_out_ << type_name << "\">";
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << prog_name << ".";
      len += prog_name.size() + 1;
    }
    f_out_ << type_name << "</a>";
  }
  f_out_ << "</code>";
  return (int)len;
}